

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

string * __thiscall
dynamicgraph::command::Command::getDocstring_abi_cxx11_
          (string *__return_storage_ptr__,Command *this)

{
  Command *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->docstring_);
  return __return_storage_ptr__;
}

Assistant:

std::string Command::getDocstring() const { return docstring_; }